

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

size_t __thiscall
nodecpp::log::SkippedMsgCounters::toStr(SkippedMsgCounters *this,char *buff,size_t sz)

{
  bool bVar1;
  undefined1 *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  ulong local_588 [2];
  buffer<char> local_578;
  ulong local_558;
  long local_550;
  buffer<char> *local_548;
  char local_540 [264];
  buffer<char> local_438;
  long local_418;
  ulong local_410;
  char *local_408;
  char local_400 [964];
  undefined2 local_3c;
  undefined1 local_3a;
  undefined1 local_39 [9];
  
  if (sz < 0x80) {
    assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
               ,0xdb,"sz >= reportMaxSize",true);
  }
  builtin_strncpy(buff,"<skipped:",9);
  sVar6 = 9;
  lVar5 = 0;
  bVar1 = false;
  do {
    lVar7 = 0;
    while ((local_578.size_ = (size_t)this->skippedCtrs[lVar5 + lVar7], local_578.size_ == 0 ||
           (uVar4 = sz - sVar6, sz < sVar6 || uVar4 == 0))) {
      lVar3 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      if (lVar3 + lVar5 == 5) {
        if (!bVar1) {
          local_588[0] = (ulong)this->fullCnt_;
          if (local_588[0] != 0) {
            local_558 = 0;
            local_550 = 0x3ff;
            local_578.size_ = 0;
            local_578.capacity_ = 0x100;
            local_578._vptr_buffer = (_func_int **)&PTR_grow_00129a30;
            format_str_00.size_ = 10;
            format_str_00.data_ = "indeed: {}";
            args_00.field_1.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)local_588;
            args_00.desc_ = 2;
            local_578.ptr_ = local_540;
            local_548 = &local_438;
            fmt::v7::detail::vformat_to<char>(&local_578,format_str_00,args_00);
            uVar4 = local_550 - local_558;
            local_558 = local_558 + local_578.size_;
            if (local_578.size_ <= uVar4) {
              uVar4 = local_578.size_;
            }
            if (uVar4 != 0) {
              memmove(local_548,local_540,uVar4);
            }
            if (local_558 < 0x400) {
              puVar2 = (undefined1 *)((long)&local_438._vptr_buffer + local_558);
            }
            else {
              puVar2 = local_39;
              local_3c = 0x2e2e;
              local_3a = 0x2e;
            }
            *puVar2 = 0;
            assert::onAssertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
                       ,0xee,"fullCnt_ == 0",(char *)&local_438,true);
          }
          return 0;
        }
        goto LAB_0010eb82;
      }
    }
    local_408 = buff + sVar6;
    local_578._vptr_buffer = *(_func_int ***)(LogLevelNames + lVar7 * 8 + lVar5 * 8);
    local_418 = 0;
    local_438.capacity_ = uVar4;
    if (0xff < uVar4) {
      local_438.capacity_ = 0x100;
    }
    local_438.ptr_ = local_400;
    local_438.size_ = 0;
    local_438._vptr_buffer = (_func_int **)&PTR_grow_00129a30;
    format_str.size_ = 7;
    format_str.data_ = "{}:{}, ";
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_578;
    args.desc_ = 0x2c;
    local_410 = uVar4;
    fmt::v7::detail::vformat_to<char>(&local_438,format_str,args);
    uVar4 = local_410 - local_418;
    local_418 = local_418 + local_438.size_;
    if (local_438.size_ <= uVar4) {
      uVar4 = local_438.size_;
    }
    if (uVar4 != 0) {
      memmove(local_408,local_400,uVar4);
    }
    sVar6 = sVar6 + local_418;
    lVar3 = lVar5 + lVar7;
    lVar5 = lVar5 + lVar7 + 1;
    bVar1 = true;
  } while (lVar3 != 4);
LAB_0010eb82:
  (buff + (sVar6 - 2))[0] = '>';
  (buff + (sVar6 - 2))[1] = '\n';
  return sVar6;
}

Assistant:

size_t SkippedMsgCounters::toStr( char* buff, size_t sz) {
		NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, sz >= reportMaxSize ); 
		memcpy( buff, "<skipped: ", 9 );
		size_t pos = 9;
		bool added = false;
		for ( size_t i=0; i<log_level_count; ++i )
			if ( skippedCtrs[i] && pos < sz )					
			{
				auto r = ::fmt::format_to_n( buff + pos, sz - pos, "{}:{}, ", LogLevelNames[i], skippedCtrs[i] );
				pos += r.size;
				added = true;
			}
		if ( added )
		{
			buff[pos - 2] = '>';
			buff[pos - 1] = '\n';
			return pos;
		}
		else
		{
			NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, fullCnt_ == 0, "indeed: {}", fullCnt_ ); 
			return 0;
		}
	}